

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ilist.h
# Opt level: O2

void __thiscall
spvtools::opt::BasicBlock::ForMergeAndContinueLabel
          (BasicBlock *this,function<void_(unsigned_int)> *f)

{
  Instruction *pIVar1;
  _Any_data local_28;
  code *local_18;
  code *local_10;
  
  pIVar1 = (this->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
           super_IntrusiveNodeBase<spvtools::opt::Instruction>.previous_node_;
  if ((pIVar1 != (this->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
                 super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_) &&
     (pIVar1 = (pIVar1->super_IntrusiveNodeBase<spvtools::opt::Instruction>).previous_node_,
     (pIVar1->opcode_ & ~OpUndef) == OpLoopMerge)) {
    local_28._8_8_ = 0;
    local_10 = std::
               _Function_handler<void_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/basic_block.cpp:172:21)>
               ::_M_invoke;
    local_18 = std::
               _Function_handler<void_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/basic_block.cpp:172:21)>
               ::_M_manager;
    local_28._M_unused._M_object = f;
    Instruction::ForEachInId(pIVar1,(function<void_(unsigned_int_*)> *)&local_28);
    if (local_18 != (code *)0x0) {
      (*local_18)(&local_28,&local_28,__destroy_functor);
    }
  }
  return;
}

Assistant:

iterator_template& operator--() {
      node_ = node_->previous_node_;
      return *this;
    }